

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_holding_base.hpp
# Opt level: O2

void __thiscall
prop::detail::PropertyHoldingBase<StringHolder>::copy<char_const(&)[4]>
          (PropertyHoldingBase<StringHolder> *this,char (*uref) [4])

{
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,*uref,&local_31);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void copy( V&& uref )
  {
    m_value = ::prop::detail::UnwrapIfProperty<
      typename ::prop::detail::CleanType< V > >::forward(
        std::forward< V >( uref ) );
  }